

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O0

State __thiscall
TileGate::_findNextStateAND
          (TileGate *this,State *adjacentStates,int numInputs,int numHigh,int numMiddle)

{
  int numMiddle_local;
  int numHigh_local;
  int numInputs_local;
  State *adjacentStates_local;
  TileGate *this_local;
  
  if (1 < numInputs) {
    if (numHigh == numInputs) {
      return HIGH;
    }
    if (numHigh + numMiddle == numInputs) {
      return MIDDLE;
    }
  }
  return LOW;
}

Assistant:

State TileGate::_findNextStateAND(State adjacentStates[4], int numInputs, int numHigh, int numMiddle) const {
    if (numInputs >= 2) {
        if (numHigh == numInputs) {
            return HIGH;
        } else if (numHigh + numMiddle == numInputs) {
            return MIDDLE;
        }
    }
    return LOW;
}